

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf,void *bignum,size_t size)

{
  size_t sVar1;
  ushort *puVar2;
  int iVar3;
  ulong uVar4;
  long extraout_RDX;
  char *pcVar5;
  ptls_buffer_t *ppVar6;
  
  pcVar5 = (char *)((long)bignum + size);
  if (0 < (long)size) {
    for (; *bignum == '\0'; bignum = (void *)((long)bignum + 1)) {
      size = size + -1;
      if ((long)size < 1) {
        size = 0;
        bignum = pcVar5;
        break;
      }
    }
  }
  iVar3 = ptls_buffer_reserve(buf,1);
  if (iVar3 == 0) {
    buf->base[buf->off] = '\x02';
    buf->off = buf->off + 1;
    iVar3 = 0;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(buf,1);
  if (iVar3 == 0) {
    buf->base[buf->off] = 0xff;
    buf->off = buf->off + 1;
    iVar3 = 0;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  sVar1 = buf->off;
  if (*bignum < '\0') {
    iVar3 = ptls_buffer_reserve(buf,1);
    if (iVar3 == 0) {
      buf->base[buf->off] = '\0';
      buf->off = buf->off + 1;
      iVar3 = 0;
    }
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  ppVar6 = buf;
  if ((char *)bignum == pcVar5) {
    bignum = (char *)0x1;
    iVar3 = ptls_buffer_reserve(buf,1);
    pcVar5 = (char *)bignum;
    if (iVar3 != 0) goto LAB_0010896a;
    buf->base[buf->off] = '\0';
    buf->off = buf->off + 1;
  }
  else {
    pcVar5 = (char *)size;
    iVar3 = ptls_buffer_reserve(buf,size);
    if (iVar3 != 0) goto LAB_0010896a;
    ppVar6 = (ptls_buffer_t *)(buf->base + buf->off);
    memcpy(ppVar6,bignum,size);
    buf->off = (size_t)(size + buf->off);
  }
  iVar3 = 0;
  pcVar5 = (char *)bignum;
LAB_0010896a:
  if (iVar3 == 0) {
    uVar4 = buf->off - sVar1;
    if (0x7f < uVar4) {
      ptls_buffer_push_asn1_ubigint_cold_1();
      puVar2 = *(ushort **)pcVar5;
      iVar3 = 0x32;
      if (1 < extraout_RDX - (long)puVar2) {
        *(ushort *)&ppVar6->base = *puVar2 << 8 | *puVar2 >> 8;
        *(ushort **)pcVar5 = puVar2 + 1;
        iVar3 = 0;
      }
      return iVar3;
    }
    buf->base[sVar1 - 1] = (uint8_t)uVar4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf, const void *bignum, size_t size)
{
    const uint8_t *p = bignum, *const end = p + size;
    int ret;

    /* skip zeroes */
    for (; end - p >= 1; ++p)
        if (*p != 0)
            break;

    /* emit */
    ptls_buffer_push(buf, 2);
    ptls_buffer_push_asn1_block(buf, {
        if (*p >= 0x80)
            ptls_buffer_push(buf, 0);
        if (p != end) {
            ptls_buffer_pushv(buf, p, end - p);
        } else {
            ptls_buffer_pushv(buf, "", 1);
        }
    });
    ret = 0;

Exit:
    return ret;
}